

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O0

unique_ptr<Imonitor,_std::default_delete<Imonitor>_>
registry::Registry<Imonitor>::create<>(string *class_name)

{
  size_type sVar1;
  key_type *in_RDI;
  pointer in_stack_ffffffffffffff88;
  string *psVar2;
  _Head_base<0UL,_Imonitor_*,_false> __x;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>_>_>_>
  *in_stack_ffffffffffffffa0;
  string local_50 [24];
  key_type *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  __x._M_head_impl = (Imonitor *)in_RDI;
  ctors_abi_cxx11_();
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>_>_>_>
          ::count(in_stack_ffffffffffffffa0,(key_type *)__x._M_head_impl);
  if (sVar1 == 1) {
    ctors_abi_cxx11_();
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>_>_>_>
                  *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::function<Imonitor_*()>::operator()((function<Imonitor_*()> *)in_RDI);
    std::unique_ptr<Imonitor,std::default_delete<Imonitor>>::
    unique_ptr<std::default_delete<Imonitor>,void>
              ((unique_ptr<Imonitor,_std::default_delete<Imonitor>_> *)in_RDI,
               in_stack_ffffffffffffff88);
  }
  else {
    psVar2 = local_50;
    std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __x._M_head_impl,(char *)in_RDI);
    spdlog::error<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29032a);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    std::__cxx11::string::~string(local_50);
    std::unique_ptr<Imonitor,std::default_delete<Imonitor>>::
    unique_ptr<std::default_delete<Imonitor>,void>
              ((unique_ptr<Imonitor,_std::default_delete<Imonitor>_> *)in_RDI,psVar2);
  }
  return (__uniq_ptr_data<Imonitor,_std::default_delete<Imonitor>,_true,_true>)
         (tuple<Imonitor_*,_std::default_delete<Imonitor>_>)__x._M_head_impl;
}

Assistant:

static std::unique_ptr<T> create(const std::string& class_name,
                                   Args&&... pack) {
    if (ctors().count(class_name) == 1) {
      return std::unique_ptr<T>(
          ctors()[class_name](std::forward<Args>(pack)...));
    }
    spdlog::error("Registry: class " + class_name + " is not registered.");
    return std::unique_ptr<T>(nullptr);
  }